

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  uint uVar1;
  int iVar2;
  ImFont **__src;
  ImFontConfig *pIVar3;
  ImFont *pIVar4;
  ImFont **__dest;
  ImFontConfig *__dest_00;
  long lVar5;
  void *__dest_01;
  int iVar6;
  char *__function;
  int iVar7;
  
  if (this->Locked == true) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                  ,0x640,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if ((font_cfg->FontData == (void *)0x0) || (font_cfg->FontDataSize < 1)) {
    __assert_fail("font_cfg->FontData != __null && font_cfg->FontDataSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                  ,0x641,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if (font_cfg->SizePixels <= 0.0) {
    __assert_fail("font_cfg->SizePixels > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                  ,0x642,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if (font_cfg->MergeMode == false) {
    pIVar4 = (ImFont *)ImGui::MemAlloc(0x70);
    (pIVar4->IndexAdvanceX).Size = 0;
    (pIVar4->IndexAdvanceX).Capacity = 0;
    (pIVar4->IndexAdvanceX).Data = (float *)0x0;
    pIVar4->FallbackAdvanceX = 0.0;
    pIVar4->FontSize = 0.0;
    (pIVar4->IndexLookup).Size = 0;
    (pIVar4->IndexLookup).Capacity = 0;
    (pIVar4->IndexLookup).Data = (unsigned_short *)0x0;
    (pIVar4->Glyphs).Size = 0;
    (pIVar4->Glyphs).Capacity = 0;
    (pIVar4->Glyphs).Data = (ImFontGlyph *)0x0;
    pIVar4->DirtyLookupTables = false;
    pIVar4->FallbackGlyph = (ImFontGlyph *)0x0;
    (pIVar4->DisplayOffset).x = 0.0;
    (pIVar4->DisplayOffset).y = 0.0;
    pIVar4->ContainerAtlas = (ImFontAtlas *)0x0;
    pIVar4->ConfigData = (ImFontConfig *)0x0;
    pIVar4->ConfigDataCount = 0;
    pIVar4->FallbackChar = 0x3f;
    pIVar4->Scale = 1.0;
    pIVar4->Ascent = 0.0;
    pIVar4->Descent = 0.0;
    pIVar4->MetricsTotalSurface = 0;
    iVar7 = (this->Fonts).Size;
    iVar2 = (this->Fonts).Capacity;
    if (iVar7 == iVar2) {
      iVar7 = iVar7 + 1;
      if (iVar2 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar2 / 2 + iVar2;
      }
      if (iVar7 < iVar6) {
        iVar7 = iVar6;
      }
      if (iVar2 < iVar7) {
        __dest = (ImFont **)ImGui::MemAlloc((long)iVar7 << 3);
        __src = (this->Fonts).Data;
        if (__src != (ImFont **)0x0) {
          memcpy(__dest,__src,(long)(this->Fonts).Size << 3);
          ImGui::MemFree((this->Fonts).Data);
        }
        (this->Fonts).Data = __dest;
        (this->Fonts).Capacity = iVar7;
      }
    }
    (this->Fonts).Data[(this->Fonts).Size] = pIVar4;
    (this->Fonts).Size = (this->Fonts).Size + 1;
  }
  else if ((this->Fonts).Size == 0) {
    __assert_fail("!Fonts.empty() && \"Cannot use MergeMode for the first font\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                  ,0x648,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  iVar7 = (this->ConfigData).Size;
  iVar2 = (this->ConfigData).Capacity;
  if (iVar7 == iVar2) {
    iVar7 = iVar7 + 1;
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      __dest_00 = (ImFontConfig *)ImGui::MemAlloc((long)iVar7 * 0x88);
      pIVar3 = (this->ConfigData).Data;
      if (pIVar3 != (ImFontConfig *)0x0) {
        memcpy(__dest_00,pIVar3,(long)(this->ConfigData).Size * 0x88);
        ImGui::MemFree((this->ConfigData).Data);
      }
      (this->ConfigData).Data = __dest_00;
      (this->ConfigData).Capacity = iVar7;
    }
  }
  memcpy((this->ConfigData).Data + (this->ConfigData).Size,font_cfg,0x88);
  iVar7 = (this->ConfigData).Size;
  uVar1 = iVar7 + 1;
  (this->ConfigData).Size = uVar1;
  if (-1 < iVar7) {
    pIVar3 = (this->ConfigData).Data;
    if (pIVar3[(ulong)uVar1 - 1].DstFont == (ImFont *)0x0) {
      lVar5 = (long)(this->Fonts).Size;
      if (lVar5 < 1) {
        __function = "T &ImVector<ImFont *>::back() [T = ImFont *]";
        goto LAB_0030a448;
      }
      pIVar3[(ulong)uVar1 - 1].DstFont = (this->Fonts).Data[lVar5 + -1];
    }
    if (pIVar3[(ulong)uVar1 - 1].FontDataOwnedByAtlas == false) {
      __dest_01 = ImGui::MemAlloc((long)pIVar3[(ulong)uVar1 - 1].FontDataSize);
      pIVar3[(ulong)uVar1 - 1].FontData = __dest_01;
      pIVar3[(ulong)uVar1 - 1].FontDataOwnedByAtlas = true;
      memcpy(__dest_01,font_cfg->FontData,(long)pIVar3[(ulong)uVar1 - 1].FontDataSize);
    }
    ClearTexData(this);
    return pIVar3[(ulong)uVar1 - 1].DstFont;
  }
  __function = "T &ImVector<ImFontConfig>::back() [T = ImFontConfig]";
LAB_0030a448:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.h"
                ,0x4e8,__function);
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = IM_ALLOC(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}